

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandListAppendMemoryFill
          (ze_command_list_handle_t hCommandList,void *ptr,void *pattern,size_t pattern_size,
          size_t size,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  ze_pfnCommandListAppendMemoryFill_t pfnAppendMemoryFill;
  ze_result_t result;
  ze_event_handle_t hSignalEvent_local;
  size_t size_local;
  size_t pattern_size_local;
  void *pattern_local;
  void *ptr_local;
  ze_command_list_handle_t hCommandList_local;
  
  pfnAppendMemoryFill._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c390 != (code *)0x0) {
    pfnAppendMemoryFill._4_4_ =
         (*DAT_0011c390)(hCommandList,ptr,pattern,pattern_size,size,hSignalEvent,numWaitEvents,
                         phWaitEvents);
  }
  return pfnAppendMemoryFill._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendMemoryFill(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        void* ptr,                                      ///< [in] pointer to memory to initialize
        const void* pattern,                            ///< [in] pointer to value to initialize memory to
        size_t pattern_size,                            ///< [in] size in bytes of the value to initialize memory to
        size_t size,                                    ///< [in] size in bytes to initialize
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAppendMemoryFill = context.zeDdiTable.CommandList.pfnAppendMemoryFill;
        if( nullptr != pfnAppendMemoryFill )
        {
            result = pfnAppendMemoryFill( hCommandList, ptr, pattern, pattern_size, size, hSignalEvent, numWaitEvents, phWaitEvents );
        }
        else
        {
            // generic implementation
        }

        return result;
    }